

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

reentrant_put_transaction<void> *
density_tests::detail::
PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
               *i_queue,EasyRandom *i_rand)

{
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::Data>
  put;
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::Data>
  local_68;
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::Data>
  local_40;
  
  density::
  sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  start_reentrant_emplace<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>>::Data>
            (&local_40,
             (sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)i_queue);
  local_68.m_put.m_control_block = local_40.m_put.m_control_block;
  local_68.m_put.m_next_ptr = local_40.m_put.m_next_ptr;
  local_68.m_put.m_user_storage = local_40.m_put.m_user_storage;
  local_68.m_queue = local_40.m_queue;
  local_40.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::Data>
  ::~reentrant_put_transaction(&local_40);
  PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>>
  ::
  put_impl<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>::reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>>::Data>>
            (&local_68,i_rand);
  (__return_storage_ptr__->m_put).m_user_storage = local_68.m_put.m_user_storage;
  (__return_storage_ptr__->m_put).m_control_block = local_68.m_put.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_68.m_put.m_next_ptr;
  __return_storage_ptr__->m_queue = local_68.m_queue;
  local_68.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::
  reentrant_put_transaction<density_tests::detail::PutRawBlocks<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::Data>
  ::~reentrant_put_transaction(&local_68);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<>
              reentrant_put(QUEUE & i_queue, EasyRandom & i_rand)
            {
                auto put = i_queue.template start_reentrant_emplace<ElementType>();
                put_impl(put, i_rand);
                return std::move(put);
            }